

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall
BN::expLeftToRightK_ary
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference bn;
  BN local_c0;
  BN local_a8;
  BN local_80;
  BN local_68;
  ulong local_50;
  size_t k;
  size_t b;
  int local_38;
  bt value;
  int i;
  vector<BN,_std::allocator<BN>_> *g_local;
  BN *mod_local;
  BN *exponent_local;
  BN *this_local;
  BN *A;
  
  _i = g;
  g_local = (vector<BN,_std::allocator<BN>_> *)mod;
  mod_local = exponent;
  exponent_local = this;
  this_local = __return_storage_ptr__;
  bVar1 = is0(exponent);
  if (bVar1) {
    bn1();
  }
  else {
    value._1_1_ = 0;
    bn1();
    sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&mod_local->ba);
    local_38 = (int)sVar2;
    while (local_38 = local_38 + -1, -1 < local_38) {
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&mod_local->ba,(long)local_38);
      b._6_2_ = *pvVar3;
      for (k = 1; k < 2; k = k - 1) {
        for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
          Qrt(&local_80,__return_storage_ptr__);
          operator%(&local_68,&local_80,(BN *)g_local);
          operator=(__return_storage_ptr__,&local_68);
          ~BN(&local_68);
          ~BN(&local_80);
        }
        bn = std::vector<BN,_std::allocator<BN>_>::operator[]
                       (_i,(ulong)(b._6_2_ >> (((byte)k & 3) << 3) & 0xff));
        operator*(&local_c0,__return_storage_ptr__,bn);
        operator%(&local_a8,&local_c0,(BN *)g_local);
        operator=(__return_storage_ptr__,&local_a8);
        ~BN(&local_a8);
        ~BN(&local_c0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expLeftToRightK_ary(const BN& exponent, const BN& mod, const vector<BN>& g) const {
    if(exponent.is0())
        return BN::bn1();

    BN A(BN::bn1());
    for(int i = exponent.ba.size() - 1; i >= 0; i--) {
        bt value = exponent.ba[i];
        for (size_t b = bz - 1; b < bz; --b) {
            for(size_t k = 0; k < KaryBits; k++)
                A = A.Qrt() % mod;
            A = A * g[(value >> KaryBits * b) & KaryMask] % mod;
        }
    }
    return A;
}